

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

int Jf_ObjCutFilterBoth(Jf_Man_t *p,Jf_Cut_t **pSto,int c)

{
  uint uVar1;
  Jf_Cut_t *pJVar2;
  Jf_Cut_t *pJVar3;
  uint uVar4;
  ulong uVar5;
  int nLits_1;
  uint uVar6;
  uint uVar7;
  int nLits;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  
  if (0 < c) {
    uVar5 = (ulong)(uint)c;
    pJVar2 = pSto[uVar5];
    uVar7 = pJVar2->pCut[0];
    uVar8 = uVar7 & 0xf;
    uVar9 = 0;
    do {
      pJVar3 = pSto[uVar9];
      uVar1 = pJVar3->pCut[0];
      if (((int)uVar1 <= (int)uVar7) && ((pJVar3->Sign & ~pJVar2->Sign) == 0)) {
        if ((uVar1 & 0xf) == 0) {
LAB_00705e5a:
          pJVar2->pCut[0] = -1;
          return c;
        }
        lVar10 = 1;
        do {
          if (pJVar3->pCut[lVar10] < 0) goto LAB_00705e97;
          if (uVar8 == 0) {
            iVar11 = 1;
          }
          else {
            uVar12 = 0;
            do {
              if (pJVar2->pCut[uVar12 + 1] < 0) goto LAB_00705e97;
              if ((uint)(pJVar2->pCut[uVar12 + 1] ^ pJVar3->pCut[lVar10]) < 2) {
                iVar11 = (int)uVar12 + 1;
                break;
              }
              uVar12 = uVar12 + 1;
              iVar11 = uVar8 + 1;
            } while (uVar8 != uVar12);
          }
          if ((int)uVar7 < iVar11) break;
          lVar10 = lVar10 + 1;
          if (lVar10 == ((ulong)uVar1 & 0xf) + 1) goto LAB_00705e5a;
        } while( true );
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar5);
    if (0 < c) {
      uVar9 = 0;
      uVar7 = 0;
      do {
        pJVar2 = pSto[uVar5];
        uVar8 = pJVar2->pCut[0];
        pJVar3 = pSto[uVar9];
        uVar1 = pJVar3->pCut[0];
        if (((int)uVar8 < (int)uVar1) && ((pJVar2->Sign & ~pJVar3->Sign) == 0)) {
          uVar4 = uVar7;
          if ((uVar8 & 0xf) != 0) {
            uVar6 = uVar1 & 0xf;
            lVar10 = 1;
            do {
              if (pJVar2->pCut[lVar10] < 0) {
LAB_00705e97:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf2,"int Abc_Lit2Var(int)");
              }
              if (uVar6 == 0) {
                iVar11 = 1;
              }
              else {
                uVar12 = 0;
                do {
                  if (pJVar3->pCut[uVar12 + 1] < 0) goto LAB_00705e97;
                  if ((uint)(pJVar3->pCut[uVar12 + 1] ^ pJVar2->pCut[lVar10]) < 2) {
                    iVar11 = (int)uVar12 + 1;
                    break;
                  }
                  uVar12 = uVar12 + 1;
                  iVar11 = uVar6 + 1;
                } while (uVar6 != uVar12);
              }
              if ((int)uVar1 < iVar11) goto LAB_00705e2e;
              lVar10 = lVar10 + 1;
            } while (lVar10 != ((ulong)uVar8 & 0xf) + 1);
          }
        }
        else {
LAB_00705e2e:
          uVar4 = uVar7 + 1;
          if (uVar9 != uVar7) {
            pJVar2 = pSto[(int)uVar7];
            pSto[(int)uVar7] = pJVar3;
            pSto[uVar9] = pJVar2;
          }
        }
        uVar7 = uVar4;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
      goto LAB_00705e66;
    }
  }
  uVar7 = 0;
LAB_00705e66:
  if ((int)uVar7 <= c) {
    if ((int)uVar7 < c) {
      pJVar2 = pSto[(int)uVar7];
      pSto[(int)uVar7] = pSto[c];
      pSto[c] = pJVar2;
    }
    return uVar7;
  }
  __assert_fail("last <= c",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                ,0x30e,"int Jf_ObjCutFilterBoth(Jf_Man_t *, Jf_Cut_t **, int)");
}

Assistant:

int Jf_ObjCutFilterBoth( Jf_Man_t * p, Jf_Cut_t ** pSto, int c )
{
    int k, last;
    // filter this cut using other cuts
    for ( k = 0; k < c; k++ )
        if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
            (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
             Jf_CutIsContained1(pSto[c]->pCut, pSto[k]->pCut) )
        {
                pSto[c]->pCut[0] = -1;
                return c;
        }
    // filter other cuts using this cut
    for ( k = last = 0; k < c; k++ )
        if ( !(pSto[c]->pCut[0] < pSto[k]->pCut[0] && 
              (pSto[c]->Sign & pSto[k]->Sign) == pSto[c]->Sign && 
               Jf_CutIsContained1(pSto[k]->pCut, pSto[c]->pCut)) )
        {
            if ( last++ == k )
                continue;
            ABC_SWAP( Jf_Cut_t *, pSto[last-1], pSto[k] );
        }
    assert( last <= c );
    if ( last < c )
        ABC_SWAP( Jf_Cut_t *, pSto[last], pSto[c] );
    return last;
}